

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

void gai_iterator_reset(_iterator_hdl *hdl)

{
  short sVar1;
  long lVar2;
  Integer _ndim_3;
  Integer _i_3;
  Integer _itmp_3;
  Integer _ndim_2;
  Integer _i_2;
  Integer _itmp_2;
  Integer _ndim_1;
  Integer _i_1;
  Integer _itmp_1;
  Integer _ndim;
  Integer _i;
  Integer _itmp;
  Integer handle;
  _iterator_hdl *hdl_local;
  
  lVar2 = hdl->g_a + 1000;
  if (GA[lVar2].distr_type == 0) {
    hdl->count = 0;
  }
  else if (GA[lVar2].distr_type == 1) {
    hdl->iproc = 0;
    hdl->iblock = 0;
    hdl->offset = 0;
  }
  else if (GA[lVar2].distr_type == 2) {
    hdl->iproc = 0;
    hdl->offset = 0;
    sVar1 = GA[lVar2].ndim;
    _itmp = hdl->iproc;
    hdl->proc_index[0] = _itmp % (long)GA[lVar2].nblock[0];
    for (_i = 1; _i < sVar1; _i = _i + 1) {
      _itmp = (_itmp - hdl->blk_size[_i + 6]) / (long)GA[lVar2].nblock[_i + -1];
      hdl->proc_index[_i] = _itmp % (long)GA[lVar2].nblock[_i];
    }
    sVar1 = GA[lVar2].ndim;
    _itmp_1 = hdl->iproc;
    hdl->index[0] = _itmp_1 % (long)GA[lVar2].nblock[0];
    for (_i_1 = 1; _i_1 < sVar1; _i_1 = _i_1 + 1) {
      _itmp_1 = (_itmp_1 - hdl->proc_index[_i_1 + 6]) / (long)GA[lVar2].nblock[_i_1 + -1];
      hdl->index[_i_1] = _itmp_1 % (long)GA[lVar2].nblock[_i_1];
    }
  }
  else if ((GA[lVar2].distr_type == 3) || (GA[lVar2].distr_type == 4)) {
    hdl->iproc = 0;
    hdl->offset = 0;
    sVar1 = GA[lVar2].ndim;
    _itmp_2 = hdl->iproc;
    hdl->proc_index[0] = _itmp_2 % (long)GA[lVar2].nblock[0];
    for (_i_2 = 1; _i_2 < sVar1; _i_2 = _i_2 + 1) {
      _itmp_2 = (_itmp_2 - hdl->blk_size[_i_2 + 6]) / (long)GA[lVar2].nblock[_i_2 + -1];
      hdl->proc_index[_i_2] = _itmp_2 % (long)GA[lVar2].nblock[_i_2];
    }
    sVar1 = GA[lVar2].ndim;
    _itmp_3 = hdl->iproc;
    hdl->index[0] = _itmp_3 % (long)GA[lVar2].nblock[0];
    for (_i_3 = 1; _i_3 < sVar1; _i_3 = _i_3 + 1) {
      _itmp_3 = (_itmp_3 - hdl->proc_index[_i_3 + 6]) / (long)GA[lVar2].nblock[_i_3 + -1];
      hdl->index[_i_3] = _itmp_3 % (long)GA[lVar2].nblock[_i_3];
    }
  }
  return;
}

Assistant:

void gai_iterator_reset(_iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + hdl->g_a;
  if (GA[handle].distr_type == REGULAR) {
    /* Regular data distribution */
    hdl->count = 0;
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* simple block cyclic data distribution */
    hdl->iproc = 0;
    hdl->iblock = 0;
    hdl->offset = 0;
  } else if (GA[handle].distr_type == SCALAPACK) {
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED ||
      GA[handle].distr_type == TILED_IRREG)  {
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  }
}